

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Collision_PDU::Encode(Collision_PDU *this,KDataStream *stream)

{
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_IssuingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_IssuingEntityID,stream);
  (*(this->m_CollidingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_CollidingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  KDataStream::Write(stream,this->m_ui8CollisionType);
  KDataStream::Write(stream,this->m_ui8Padding);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32Mass);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  return;
}

Assistant:

void Collision_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_IssuingEntityID
           << KDIS_STREAM m_CollidingEntityID
           << KDIS_STREAM m_EventID
           << m_ui8CollisionType
           << m_ui8Padding
           << KDIS_STREAM m_Velocity
           << m_f32Mass
           << KDIS_STREAM m_Location;
}